

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZContBufferedStream.cpp
# Opt level: O2

void __thiscall
TPZContBufferedStream::ConstReadFromBuffer(TPZContBufferedStream *this,char *dest,size_t *nBytes)

{
  ostream *poVar1;
  string sStack_58;
  string msg;
  
  if (this->fSize < *nBytes) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&msg,"TPZContBufferedStream: Cannot read ",(allocator<char> *)&sStack_58);
    std::__cxx11::to_string(&sStack_58,*nBytes);
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::~string((string *)&sStack_58);
    std::__cxx11::string::append((char *)&msg);
    std::__cxx11::to_string(&sStack_58,this->fSize);
    std::__cxx11::string::append((string *)&msg);
    std::__cxx11::string::~string((string *)&sStack_58);
    std::__cxx11::string::append((char *)&msg);
    poVar1 = std::operator<<((ostream *)&std::cerr,(string *)&msg);
    std::endl<char,std::char_traits<char>>(poVar1);
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Save/TPZContBufferedStream.cpp"
               ,0x59);
  }
  memcpy(dest,this->fFirst,*nBytes);
  return;
}

Assistant:

void TPZContBufferedStream::ConstReadFromBuffer(char *dest,
        const size_t &nBytes) const {
    if (nBytes > fSize) {
        std::string msg("TPZContBufferedStream: Cannot read ");
        msg.append(std::to_string(nBytes));
        msg.append(" bytes; there are only ");
        msg.append(std::to_string(fSize));
        msg.append(" available.");
        PZError << msg << std::endl;
        DebugStop();
    }
    char *endBuffer = fBuffer + fNAllocatedBytes;
    memcpy(dest, fFirst, nBytes);
}